

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O2

void av1_set_ssim_rdmult(AV1_COMP *cpi,int *errorperbit,BLOCK_SIZE bsize,int mi_row,int mi_col,
                        int *rdmult)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined7 in_register_00000011;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  
  uVar8 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  iVar2 = ((cpi->common).mi_params.mi_cols + 3) / 4;
  iVar5 = ((cpi->common).mi_params.mi_rows + 3) / 4;
  iVar4 = ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar8] + 3
          >> 2) + mi_row / 4;
  if (iVar5 < iVar4) {
    iVar4 = iVar5;
  }
  iVar5 = ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar8] + 3
          >> 2) + mi_col / 4;
  if (iVar2 < iVar5) {
    iVar5 = iVar2;
  }
  lVar6 = (long)(mi_row / 4);
  lVar7 = lVar6 * iVar2 * 8;
  dVar11 = 0.0;
  dVar10 = 1.0;
  for (; lVar9 = (long)(mi_col / 4), lVar6 < iVar4; lVar6 = lVar6 + 1) {
    for (; lVar9 < iVar5; lVar9 = lVar9 + 1) {
      dVar10 = dVar10 * *(double *)((long)cpi->ssim_rdmult_scaling_factors + lVar9 * 8 + lVar7);
      dVar11 = dVar11 + 1.0;
    }
    lVar7 = lVar7 + (long)iVar2 * 8;
  }
  dVar10 = pow(dVar10,1.0 / dVar11);
  uVar1 = (uint)((double)*rdmult * dVar10 + 0.5);
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  *rdmult = uVar3;
  *errorperbit = (uVar3 >> 6) + (uint)(uVar3 >> 6 == 0);
  return;
}

Assistant:

void av1_set_ssim_rdmult(const AV1_COMP *const cpi, int *errorperbit,
                         const BLOCK_SIZE bsize, const int mi_row,
                         const int mi_col, int *const rdmult) {
  const AV1_COMMON *const cm = &cpi->common;

  const BLOCK_SIZE bsize_base = BLOCK_16X16;
  const int num_mi_w = mi_size_wide[bsize_base];
  const int num_mi_h = mi_size_high[bsize_base];
  const int num_cols = (cm->mi_params.mi_cols + num_mi_w - 1) / num_mi_w;
  const int num_rows = (cm->mi_params.mi_rows + num_mi_h - 1) / num_mi_h;
  const int num_bcols = (mi_size_wide[bsize] + num_mi_w - 1) / num_mi_w;
  const int num_brows = (mi_size_high[bsize] + num_mi_h - 1) / num_mi_h;
  int row, col;
  double num_of_mi = 0.0;
  double geom_mean_of_scale = 1.0;

  // To avoid overflow of 'geom_mean_of_scale', bsize_base must be at least
  // BLOCK_8X8.
  //
  // For bsize=BLOCK_128X128 and bsize_base=BLOCK_8X8, the loop below would
  // iterate 256 times. Considering the maximum value of
  // cpi->ssim_rdmult_scaling_factors (see av1_set_mb_ssim_rdmult_scaling()),
  // geom_mean_of_scale can go up to 4.8323^256, which is within DBL_MAX
  // (maximum value a double data type can hold). If bsize_base is modified to
  // BLOCK_4X4 (minimum possible block size), geom_mean_of_scale can go up
  // to 4.8323^1024 and exceed DBL_MAX, resulting in data overflow.
  assert(bsize_base >= BLOCK_8X8);
  assert(cpi->oxcf.tune_cfg.tuning == AOM_TUNE_SSIM ||
         cpi->oxcf.tune_cfg.tuning == AOM_TUNE_IQ ||
         cpi->oxcf.tune_cfg.tuning == AOM_TUNE_SSIMULACRA2);

  for (row = mi_row / num_mi_w;
       row < num_rows && row < mi_row / num_mi_w + num_brows; ++row) {
    for (col = mi_col / num_mi_h;
         col < num_cols && col < mi_col / num_mi_h + num_bcols; ++col) {
      const int index = row * num_cols + col;
      assert(cpi->ssim_rdmult_scaling_factors[index] != 0.0);
      geom_mean_of_scale *= cpi->ssim_rdmult_scaling_factors[index];
      num_of_mi += 1.0;
    }
  }
  geom_mean_of_scale = pow(geom_mean_of_scale, (1.0 / num_of_mi));

  *rdmult = (int)((double)(*rdmult) * geom_mean_of_scale + 0.5);
  *rdmult = AOMMAX(*rdmult, 0);
  av1_set_error_per_bit(errorperbit, *rdmult);
}